

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O2

void sigmund_getpitch(int npeak,t_peak_conflict *peakv,t_float *freqp,t_float npts,t_float srate,
                     t_float nharmonics,t_float amppower,int loud)

{
  float fVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  t_peak_conflict *ptVar10;
  long lVar11;
  t_peak_conflict *ptVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined8 auStack_100f0 [8192];
  undefined8 uStack_f0;
  float fStack_ec;
  undefined8 uStack_e8;
  t_peak_conflict *bigpeaks [12];
  float local_34;
  
  uStack_f0 = 0x1a30e2;
  uVar4 = sigmund_ilog2((int)npts);
  uVar14 = uVar4 * 0x30;
  uVar6 = (long)(int)uVar14 << 2;
  if (0xffff < uVar6) {
    uVar6 = 0x10000;
  }
  lVar2 = -uVar6;
  lVar3 = lVar2 + -0xe8;
  if (npeak < 1) {
    fVar18 = 0.0;
  }
  else {
    fVar23 = (srate * 0.5) / npts;
    uVar6 = 0;
    uVar9 = 0;
    if (0 < (int)uVar14) {
      uVar9 = (ulong)uVar14;
    }
    for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined4 *)((long)bigpeaks + uVar6 * 4 + lVar3 + 0xe0) = 0;
    }
    for (lVar11 = 0; (ulong)(uint)npeak << 5 != lVar11; lVar11 = lVar11 + 0x20) {
      *(undefined4 *)((long)&peakv->p_tmp + lVar11) = 0;
      *(float *)((long)&peakv->p_salience + lVar11) =
           *(float *)((long)&peakv->p_pit + lVar11) * -0.0 + *(float *)((long)&peakv->p_db + lVar11)
      ;
    }
    for (uVar6 = 0; uVar6 != 0xc; uVar6 = uVar6 + 1) {
      ptVar10 = (t_peak_conflict *)0x0;
      ptVar12 = peakv;
      uVar13 = (ulong)(uint)npeak;
      fVar18 = -1e+20;
      while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
        if (((ptVar12->p_tmp == 0.0) && (!NAN(ptVar12->p_tmp))) && (fVar18 < ptVar12->p_salience)) {
          ptVar10 = ptVar12;
          fVar18 = ptVar12->p_salience;
        }
        ptVar12 = ptVar12 + 1;
      }
      if (ptVar10 == (t_peak_conflict *)0x0) break;
      bigpeaks[uVar6 - 1] = ptVar10;
      ptVar10->p_tmp = 1.0;
    }
    local_34 = 0.0;
    for (uVar13 = 0; uVar13 != (uVar6 & 0xffffffff); uVar13 = uVar13 + 1) {
      ptVar10 = bigpeaks[uVar13 - 1];
      fVar18 = ptVar10->p_freq;
      *(undefined8 *)((long)&stack0xffffffffffffff10 + lVar2) = 0x1a3242;
      dVar19 = log((double)fVar18 / ((double)fVar23 + (double)fVar23));
      fVar18 = ptVar10->p_amp;
      *(undefined8 *)((long)&stack0xffffffffffffff10 + lVar2) = 0x1a3263;
      dVar20 = pow((double)fVar18,(double)amppower);
      iVar16 = 0;
      while (iVar15 = iVar16, iVar15 != 0x10) {
        iVar16 = iVar15 + 1;
        *(undefined8 *)((long)&stack0xffffffffffffff10 + lVar2) = 0x1a329a;
        dVar21 = log((double)iVar16);
        uVar5 = (uint)((float)(dVar21 * -69.24936196267028 +
                              (double)(float)(dVar19 * 69.24936196267028)) + -0.5);
        if ((int)uVar5 < -2) break;
        uVar8 = uVar5 + 2;
        if (SBORROW4(uVar8,uVar14) != (int)(uVar8 + uVar4 * -0x30) < 0) {
          uVar7 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar7 = 0;
          }
          for (; uVar7 <= uVar8; uVar7 = uVar7 + 1) {
            *(float *)((long)bigpeaks + uVar7 * 4 + lVar3 + 0xe0) =
                 *(float *)((long)bigpeaks + uVar7 * 4 + lVar3 + 0xe0) +
                 ((float)dVar20 * nharmonics) / ((float)iVar15 + nharmonics);
          }
        }
      }
      local_34 = local_34 + (float)dVar20;
    }
    fVar22 = -1.0;
    fVar18 = -1e+20;
    for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
      fVar1 = *(float *)((long)bigpeaks + uVar13 * 4 + lVar3 + 0xe0);
      fVar26 = fVar1;
      if (fVar1 <= fVar18) {
        fVar26 = fVar18;
      }
      fVar22 = (float)(~-(uint)(fVar18 < fVar1) & (uint)fVar22 |
                      (uint)(float)(int)uVar13 & -(uint)(fVar18 < fVar1));
      fVar18 = fVar26;
    }
    if (fVar18 < local_34 * 0.4) {
      fVar22 = -1.0;
    }
    fVar18 = 0.0;
    if (0.0 <= fVar22) {
      if ((0.0 < fVar22) && (fVar22 < (float)(int)(uVar14 - 1))) {
        lVar11 = (long)(int)fVar22;
        fVar18 = *(float *)((long)&fStack_ec + lVar11 * 4 + lVar2);
        fVar1 = *(float *)((long)bigpeaks + lVar11 * 4 + lVar2 + -4);
        fVar22 = fVar22 + (fVar1 - fVar18) /
                          (fVar1 + *(float *)((long)bigpeaks + lVar11 * 4 + lVar3 + 0xe0) + fVar18);
      }
      *(undefined8 *)((long)&stack0xffffffffffffff10 + lVar2) = 0x1a33f2;
      dVar19 = exp((double)fVar22 * 0.01444056626166552);
      fVar18 = (float)(dVar19 * (double)(fVar23 + fVar23));
      fVar23 = 0.0;
      fVar22 = 0.0;
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        fVar1 = bigpeaks[uVar9 - 1]->p_freq;
        fVar25 = fVar1 / fVar18;
        fVar26 = fVar25 + 0.5;
        if ((int)fVar26 - 1U < 0x10) {
          iVar16 = (int)fVar26;
          fVar24 = (float)iVar16;
          fVar25 = fVar25 - fVar24;
          fVar26 = (float)iVar16 * 0.015;
          if ((fVar25 < fVar26) && (-fVar26 < fVar25)) {
            fVar26 = bigpeaks[uVar9 - 1]->p_amp * fVar24;
            fVar23 = fVar23 + fVar26;
            fVar22 = fVar22 + (fVar1 * fVar26) / fVar24;
          }
        }
      }
      if (0.0 < fVar23) {
        fVar18 = fVar22 / fVar23;
      }
    }
  }
  *freqp = (t_float)(-(uint)(!NAN(fVar18) && !NAN(fVar18)) & (uint)fVar18);
  return;
}

Assistant:

static void sigmund_getpitch(int npeak, t_peak *peakv, t_float *freqp,
    t_float npts, t_float srate, t_float nharmonics, t_float amppower, int loud)
{
    t_float fperbin = 0.5 * srate / npts;
    int npit = 48 * sigmund_ilog2(npts), i, j, k, nsalient;
    t_float bestbin, bestweight, sumamp, sumweight, sumfreq, freq;
    t_float *weights =  0;
    t_peak *bigpeaks[PITCHNPEAK];
    size_t weight_len = sizeof(t_float) * npit;
    if(weight_len > 65536)
      weight_len = 65536;
    weights = (t_float *)alloca(weight_len);
    if (npeak < 1)
    {
        freq = 0;
        goto done;
    }
    for (i = 0; i < npit; i++)
        weights[i] = 0;
    for (i = 0; i < npeak; i++)
    {
        peakv[i].p_tmp = 0;
        peakv[i].p_salience = peakv[i].p_db - DBPERHALFTONE * peakv[i].p_pit;
    }
    for (nsalient = 0; nsalient < PITCHNPEAK; nsalient++)
    {
        t_peak *bestpeak = 0;
        t_float bestsalience = -1e20;
        for (j = 0; j < npeak; j++)
            if (peakv[j].p_tmp == 0 && peakv[j].p_salience > bestsalience)
        {
            bestsalience = peakv[j].p_salience;
            bestpeak = &peakv[j];
        }
        if (!bestpeak)
            break;
        bigpeaks[nsalient] = bestpeak;
        bestpeak->p_tmp = 1;
        /* post("peak f=%f a=%f", bestpeak->p_freq, bestpeak->p_amp); */
    }
    sumweight = 0;
    for (i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float weightindex = (48./LOG2) *
            log(thispeak->p_freq/(2.*fperbin));
        t_float loudness = pow(thispeak->p_amp, amppower);
        /* post("index %f, uncertainty %f", weightindex, pitchuncertainty); */
        for (j = 0; j < SUBHARMONICS; j++)
        {
            t_float subindex = weightindex -
                (48./LOG2) * log(j + 1.);
            int loindex = subindex - 0.5;
            int hiindex = loindex+2;
            if (hiindex < 0)
                break;
            if (hiindex >= npit)
                continue;
            if (loindex < 0)
                loindex = 0;
            for (k = loindex; k <= hiindex; k++)
                weights[k] += loudness * nharmonics / (nharmonics + j);
        }
        sumweight += loudness;
    }
    bestbin = -1;
    bestweight = -1e20;
    for (i = 0; i < npit; i++)
        if (weights[i] > bestweight)
            bestweight = weights[i], bestbin = i;
    if (bestweight < sumweight * 0.4)
        bestbin = -1;
    
    if (bestbin < 0)
    {
        freq = 0;
        goto done;
    }
    if (bestbin > 0 && bestbin < npit-1)
    {
        int ibest = bestbin;
        bestbin += (weights[ibest+1] - weights[ibest-1]) /
            (weights[ibest+1] +  weights[ibest] + weights[ibest-1]);
    }
    freq = 2*fperbin * exp((LOG2/48.)*bestbin);
    for (sumamp = sumweight = sumfreq = 0, i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float thisloudness = thispeak->p_amp;
        t_float thisfreq = thispeak->p_freq;
        t_float harmonic = thisfreq/freq;
        t_float intpart = (int)(0.5 + harmonic);
        t_float inharm = harmonic - intpart;
#if 0
        if (loud)
            post("freq %f intpart %f inharm %f", freq, intpart, inharm);
#endif
        if (intpart >= 1 && intpart <= 16 &&
            inharm < 0.015 * intpart && inharm > - (0.015 * intpart))
        {
            t_float weight = thisloudness * intpart;
            sumweight += weight;
            sumfreq += weight*thisfreq/intpart;
#if 0
            if (loud)
                post("weight %f freq %f", weight, thisfreq);
#endif
        }
    }
    if (sumweight > 0)
        freq = sumfreq / sumweight;
done:
    if (!(freq >= 0 || freq <= 0))
    {
        /* post("freq nan cancelled"); */
        freq = 0;
    }
    *freqp = freq;
}